

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excerpt_tailer.cpp
# Opt level: O1

bool __thiscall cornelich::excerpt_tailer::next_index(excerpt_tailer *this)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  int32_t iVar4;
  char *pcVar5;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  byte unaff_BPL;
  char *__s;
  int iVar6;
  
  if (this->m_index < 0) {
    uVar3 = vanilla_index::find_first_cycle(&this->m_chronicle->m_index);
    if (-1 < (int)uVar3) {
      this->m_index = (ulong)uVar3 * (this->m_chronicle->m_settings).m_entries_per_cycle + -1;
    }
    in_RDX = extraout_RDX;
    if (this->m_index < 0) {
      unaff_BPL = 0;
      goto LAB_0015f70a;
    }
  }
  __s = (char *)(this->m_index + 1);
  do {
    pcVar5 = index(this,__s,(int)in_RDX);
    if ((char)pcVar5 == '\0') {
      lVar1 = (this->m_chronicle->m_settings).m_entries_per_cycle;
      iVar4 = cycle_for_now((this->m_chronicle->m_settings).m_cycle_length);
      iVar6 = (int)((long)__s / lVar1);
      bVar2 = iVar6 <= iVar4;
      in_RDX = extraout_RDX_01;
      if (iVar4 < iVar6) {
        unaff_BPL = 0;
      }
      else {
        __s = (char *)((long)(iVar6 + 1) * (this->m_chronicle->m_settings).m_entries_per_cycle);
        bVar2 = true;
      }
    }
    else {
      this->m_index = (int64_t)__s;
      unaff_BPL = 1;
      bVar2 = false;
      in_RDX = extraout_RDX_00;
    }
  } while (bVar2);
LAB_0015f70a:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool excerpt_tailer::next_index()
{
    if(m_index < 0)
    {
        to_start();
        if(m_index < 0)
            return false;
    }

    auto next = m_index + 1;
    while(true)
    {
        auto found = index(next);
        if(found)
        {
            m_index = next;
            return true;
        }

        auto cycle = static_cast<std::int32_t>(next / m_chronicle.m_settings.entries_per_cycle());
        if(cycle > cycle_for_now(m_chronicle.m_settings.cycle_length()))
            return false;
        next = (cycle + 1) * m_chronicle.m_settings.entries_per_cycle();
    }
}